

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::getBasisInverseRow
          (Highs *this,HighsInt row,double *row_vector,HighsInt *row_num_nz,HighsInt *row_indices)

{
  uint uVar1;
  HighsStatus HVar2;
  vector<double,_std::allocator<double>_> rhs;
  value_type_conflict1 local_50;
  string local_48;
  
  if (row_vector == (double *)0x0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "getBasisInverseRow: row_vector is NULL\n");
  }
  else {
    uVar1 = (this->model_).lp_.num_row_;
    if (-1 < row && row < (int)uVar1) {
      if ((this->ekk_instance_).status_.has_invert != false) {
        rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_50 = 0.0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign(&rhs,(ulong)uVar1,&local_50);
        rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[(uint)row] = 1.0;
        basisSolveInterface(this,&rhs,row_vector,row_num_nz,row_indices,true);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&rhs.super__Vector_base<double,_std::allocator<double>_>);
        return kOk;
      }
      std::__cxx11::string::string((string *)&local_48,"getBasisInverseRow",(allocator *)&rhs);
      HVar2 = invertRequirementError(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      return HVar2;
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Row index %d out of range [0, %d] in getBasisInverseRow\n",(ulong)(uint)row,
                 (ulong)(uVar1 - 1));
  }
  return kError;
}

Assistant:

HighsStatus Highs::getBasisInverseRow(const HighsInt row, double* row_vector,
                                      HighsInt* row_num_nz,
                                      HighsInt* row_indices) {
  if (row_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasisInverseRow: row_vector is NULL\n");
    return HighsStatus::kError;
  }
  // row_indices can be NULL - it's the trigger that determines
  // whether they are identified or not
  HighsInt num_row = model_.lp_.num_row_;
  if (row < 0 || row >= num_row) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Row index %" HIGHSINT_FORMAT
                 " out of range [0, %" HIGHSINT_FORMAT
                 "] in getBasisInverseRow\n",
                 row, num_row - 1);
    return HighsStatus::kError;
  }
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getBasisInverseRow");
  // Compute a row i of the inverse of the basis matrix by solving B^Tx=e_i
  vector<double> rhs;
  rhs.assign(num_row, 0);
  rhs[row] = 1;
  basisSolveInterface(rhs, row_vector, row_num_nz, row_indices, true);
  return HighsStatus::kOk;
}